

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eumorphic.hpp
# Opt level: O2

void __thiscall
eumorphic::ordered_collection<container,_a,_b,_c>::insert<b>
          (ordered_collection<container,_a,_b,_c> *this,b *value)

{
  unsigned_long local_18;
  
  local_18 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->types_order,&local_18);
  std::vector<b,_std::allocator<b>_>::emplace_back<b>
            (&(this->super_collection<container,_a,_b,_c>).data_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_std::vector<a,_std::allocator<a>_>,_std::vector<b,_std::allocator<b>_>,_std::vector<c,_std::allocator<c>_>_>
              .super_ebo<boost::hana::detail::bti<1UL>,_std::vector<b,_std::allocator<b>_>,_false>.
              data_,value);
  return;
}

Assistant:

constexpr void insert(T&& value)
		{
                        using namespace detail;
						using Td = std::decay_t<T>;
                        constexpr auto  type_index = index_of(Base::segments_container_t, hana::type_c< Container<Td> >);

                        types_order.push_back( type_index );

                        hana::at(Base::data_, type_index).push_back(std::forward<T>(value));
		}